

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

void build_node(XML_Parser parser,int src_node,XML_Content *dest,XML_Content **contpos,
               XML_Char **strpos)

{
  char cVar1;
  uint uVar2;
  int src_node_00;
  undefined4 uVar3;
  DTD *pDVar4;
  CONTENT_SCAFFOLD *pCVar5;
  undefined4 uVar8;
  char *pcVar6;
  XML_Content *pXVar7;
  char *pcVar9;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  
  pDVar4 = parser->m_dtd;
  pCVar5 = pDVar4->scaffold;
  uVar3 = pCVar5[src_node].type;
  uVar8 = pCVar5[src_node].quant;
  dest->type = uVar3;
  dest->quant = uVar8;
  if (uVar3 == 4) {
    dest->name = *strpos;
    pcVar9 = pCVar5[src_node].name;
    do {
      cVar1 = *pcVar9;
      pcVar6 = *strpos;
      *strpos = pcVar6 + 1;
      *pcVar6 = cVar1;
      cVar1 = *pcVar9;
      pcVar9 = pcVar9 + 1;
    } while (cVar1 != '\0');
    dest->numchildren = 0;
    lVar11 = 0x18;
  }
  else {
    uVar2 = pCVar5[src_node].childcnt;
    dest->numchildren = uVar2;
    pXVar7 = *contpos;
    dest->children = pXVar7;
    *contpos = pXVar7 + uVar2;
    lVar11 = 8;
    if ((ulong)uVar2 != 0) {
      piVar10 = &pDVar4->scaffold[src_node].firstchild;
      lVar11 = 0;
      uVar12 = 0;
      do {
        src_node_00 = *piVar10;
        build_node(parser,src_node_00,(XML_Content *)((long)&dest->children->type + lVar11),contpos,
                   strpos);
        uVar12 = uVar12 + 1;
        piVar10 = &pDVar4->scaffold[src_node_00].nextsib;
        lVar11 = lVar11 + 0x20;
      } while (uVar12 < dest->numchildren);
      lVar11 = 8;
    }
  }
  *(undefined8 *)((long)&dest->type + lVar11) = 0;
  return;
}

Assistant:

static void
build_node(XML_Parser parser,
           int src_node,
           XML_Content *dest,
           XML_Content **contpos,
           XML_Char **strpos)
{
  DTD * const dtd = _dtd;  /* save one level of indirection */
  dest->type = dtd->scaffold[src_node].type;
  dest->quant = dtd->scaffold[src_node].quant;
  if (dest->type == XML_CTYPE_NAME) {
    const XML_Char *src;
    dest->name = *strpos;
    src = dtd->scaffold[src_node].name;
    for (;;) {
      *(*strpos)++ = *src;
      if (!*src)
        break;
      src++;
    }
    dest->numchildren = 0;
    dest->children = NULL;
  }
  else {
    unsigned int i;
    int cn;
    dest->numchildren = dtd->scaffold[src_node].childcnt;
    dest->children = *contpos;
    *contpos += dest->numchildren;
    for (i = 0, cn = dtd->scaffold[src_node].firstchild;
         i < dest->numchildren;
         i++, cn = dtd->scaffold[cn].nextsib) {
      build_node(parser, cn, &(dest->children[i]), contpos, strpos);
    }
    dest->name = NULL;
  }
}